

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O1

void __thiscall
Clasp::Asp::PrgDepGraph::addSccs
          (PrgDepGraph *this,LogicProgram *prg,AtomList *sccAtoms,NonHcfSet *nonHcfs)

{
  pointer pLVar1;
  uint uVar2;
  PrgAtom *pPVar3;
  PrgNode PVar4;
  pointer pAVar5;
  pointer pPVar6;
  PrgBody *pPVar7;
  pointer pBVar8;
  pointer ppNVar9;
  pointer puVar10;
  SharedContext *generator;
  NonHcfSet *pNVar11;
  uint32 uVar12;
  int iVar13;
  ulong uVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NonHcfStats *pNVar15;
  uint uVar16;
  uint *puVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  pointer pLVar22;
  bool bVar23;
  NodeId bId;
  VarVec ext;
  VarVec adj;
  Memcpy<unsigned_int> local_a8;
  SharedContext *local_a0;
  LogicProgram *local_98;
  BodyVec *local_90;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  AtomNode local_78;
  ulong local_58;
  AtomList *local_50;
  uint local_44;
  NonHcfSet *local_40;
  ulong local_38;
  
  local_98 = prg;
  local_40 = nonHcfs;
  bk_lib::
  pod_vector<Clasp::Asp::PrgDepGraph::AtomNode,_std::allocator<Clasp::Asp::PrgDepGraph::AtomNode>_>
  ::reserve(&this->atoms_,(sccAtoms->ebo_).size + (this->atoms_).ebo_.size);
  local_a0 = (prg->super_ProgramBuilder).ctx_;
  uVar20 = (ulong)(sccAtoms->ebo_).size;
  local_50 = sccAtoms;
  if (uVar20 == 0) {
    uVar16 = 0;
  }
  else {
    uVar21 = 0;
    uVar16 = 0;
    local_58 = uVar20;
    do {
      pPVar3 = (local_50->ebo_).buf[uVar21];
      PVar4 = (pPVar3->super_PrgHead).super_PrgNode;
      iVar13 = PVar4._0_4_;
      if ((((-1 < iVar13) && (((ulong)PVar4 & 0x4000000000000000) == 0)) &&
          (uVar19 = *(uint *)&(pPVar3->super_PrgHead).field_0x18, (uVar19 & 0x8000000) != 0)) &&
         (((uVar19 & 0x7ffffff) != 0x7ffffff &&
          ((byte)(*(byte *)((long)((*(local_a0->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf +
                           (ulong)(iVar13 * 2 & 0xfffffffc)) & 3) != (byte)(2 - (PVar4._0_1_ & 1))))
         )) {
        uVar19 = *(uint *)&(pPVar3->super_PrgHead).field_0x18;
        uVar2 = (this->atoms_).ebo_.size;
        local_78.super_Node._0_8_ = (pointer)0x7ffffff00000000;
        local_78.super_Node.adj_ = (NodeId *)0x0;
        local_78.super_Node.sep_ = (NodeId *)0x0;
        local_90 = (BodyVec *)CONCAT44(local_90._4_4_,uVar16);
        bk_lib::
        pod_vector<Clasp::Asp::PrgDepGraph::AtomNode,_std::allocator<Clasp::Asp::PrgDepGraph::AtomNode>_>
        ::push_back(&this->atoms_,&local_78);
        pAVar5 = (this->atoms_).ebo_.buf;
        uVar16 = (this->atoms_).ebo_.size - 1;
        pAVar5[uVar16].super_Node.lit.rep_ = iVar13 * 2;
        *(uint *)&pAVar5[uVar16].super_Node.field_0x4 =
             *(uint *)&pAVar5[uVar16].super_Node.field_0x4 & 0xf0000000 | uVar19 & 0x7ffffff;
        PVar4 = (pPVar3->super_PrgHead).super_PrgNode;
        (pPVar3->super_PrgHead).super_PrgNode =
             (PrgNode)((ulong)PVar4 & 0x30000000ffffffff | (ulong)(uVar2 & 0xfffffff) << 0x20 |
                      0x8000000000000000);
        SharedContext::setFrozen(local_a0,(uint)((ulong)PVar4 >> 1) & 0x3fffffff,true);
        uVar16 = (int)local_90 + (pPVar3->super_PrgHead).supports_.ebo_.size;
        uVar20 = local_58;
      }
      uVar21 = uVar21 + 1;
    } while (uVar20 != uVar21);
    uVar16 = uVar16 >> 1;
  }
  local_78.super_Node._0_8_ = (pointer)0x0;
  local_78.super_Node.adj_ = (NodeId *)0x0;
  local_88.ebo_.buf = (uint *)0x0;
  local_88.ebo_.size = 0;
  local_88.ebo_.cap = 0;
  local_90 = &this->bodies_;
  bk_lib::
  pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
  ::reserve(local_90,uVar16 + (this->bodies_).ebo_.size);
  uVar20 = (ulong)(local_50->ebo_).size;
  if (uVar20 != 0) {
    uVar21 = 0;
    local_38 = uVar20;
    do {
      pPVar3 = (local_50->ebo_).buf[uVar21];
      PVar4 = (pPVar3->super_PrgHead).super_PrgNode;
      if (((-1 < PVar4._0_4_) && (((ulong)PVar4 & 0x4000000000000000) == 0)) &&
         ((uVar16 = *(uint *)&(pPVar3->super_PrgHead).field_0x18, (uVar16 & 0x8000000) != 0 &&
          (((uVar16 & 0x7ffffff) != 0x7ffffff &&
           ((byte)(*(byte *)((long)((*(local_a0->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf +
                            (ulong)(PVar4._0_4_ * 2 & 0xfffffffc)) & 3) !=
            (byte)(2 - (PVar4._0_1_ & 1)))))))) {
        uVar20 = (ulong)(pPVar3->super_PrgHead).supports_.ebo_.size;
        if (uVar20 == 0) {
          uVar16 = 0;
        }
        else {
          pPVar6 = (pPVar3->super_PrgHead).supports_.ebo_.buf;
          lVar18 = 0;
          uVar16 = 0;
          do {
            local_a8.first_._0_4_ = 0xfffffff;
            uVar19 = *(uint *)((long)&pPVar6->rep + lVar18);
            if ((uVar19 & 0xd) == 4) {
              pPVar7 = (local_98->bodies_).ebo_.buf[uVar19 >> 4];
              PVar4 = pPVar7->super_PrgNode;
              uVar12 = 0xfffffff;
              if ((byte)(*(byte *)((long)((*(local_a0->solvers_).ebo_.buf)->assign_).assign_.ebo_.
                                         buf + (ulong)(PVar4._0_4_ * 2 & 0xfffffffc)) & 3) !=
                  (byte)(2 - (PVar4._0_1_ & 1))) {
                uVar12 = addBody(this,local_98,pPVar7);
              }
              local_a8.first_._0_4_ = uVar12;
            }
            else if ((uVar19 & 0xc) == 8) {
              uVar12 = addDisj(this,local_98,(local_98->disjunctions_).ebo_.buf[uVar19 >> 4]);
              local_a8.first_._0_4_ = uVar12;
              uVar16 = uVar16 | 2;
            }
            uVar14 = (ulong)local_a8.first_ & 0xffffffff;
            if (uVar14 != 0xfffffff) {
              pBVar8 = (local_90->ebo_).buf;
              uVar19 = *(uint *)&pBVar8[uVar14].super_Node.field_0x4;
              if (-1 < (int)uVar19) {
                *(uint *)&pBVar8[uVar14].super_Node.field_0x4 = uVar19 | 0x80000000;
                bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                           (uint *)&local_a8);
              }
              uVar16 = uVar16 | *(uint *)((long)&pPVar6->rep + lVar18) >> 1 & 1;
            }
            lVar18 = lVar18 + 4;
          } while (uVar20 << 2 != lVar18);
        }
        local_58 = CONCAT44(local_58._4_4_,(size_type)local_78.super_Node.adj_);
        uVar20 = (ulong)(pPVar3->deps_).ebo_.size;
        if (uVar20 != 0) {
          pLVar22 = (pPVar3->deps_).ebo_.buf;
          pLVar1 = pLVar22 + uVar20;
          do {
            if ((((pLVar22->rep_ & 2) == 0) &&
                (pPVar7 = (local_98->bodies_).ebo_.buf[pLVar22->rep_ >> 2],
                (byte)(*(byte *)((long)((*(local_a0->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf
                                + (ulong)(SUB84(pPVar7->super_PrgNode,0) * 2 & 0xfffffffc)) & 3) !=
                (byte)(2 - (SUB81(pPVar7->super_PrgNode,0) & 1)))) &&
               (uVar12 = PrgBody::scc(pPVar7,local_98),
               uVar12 == (*(uint *)&(pPVar3->super_PrgHead).field_0x18 & 0x7ffffff))) {
              uVar12 = addBody(this,local_98,pPVar7);
              local_a8.first_._0_4_ = uVar12;
              if (((local_90->ebo_).buf[uVar12].super_Node.field_0x7 & 0x10) == 0) {
                bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                           (uint *)&local_a8);
              }
              else {
                bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          (&local_88,(uint *)&local_a8);
                pBVar8 = (local_90->ebo_).buf;
                puVar17 = pBVar8[(ulong)local_a8.first_ & 0xffffffff].super_Node.sep_;
                bVar23 = *puVar17 == 0xffffffff;
                local_44 = 0;
                if ((!bVar23) &&
                   (uVar19 = *(uint *)&(pPVar3->super_PrgHead).super_PrgNode.field_0x4 & 0xfffffff,
                   local_44 = 0, *puVar17 != uVar19)) {
                  local_44 = 0;
                  do {
                    puVar17 = puVar17 + (2 - (ulong)((pBVar8[(ulong)local_a8.first_ & 0xffffffff].
                                                      super_Node.field_0x7 & 0x20) == 0));
                    local_44 = local_44 + 1;
                    bVar23 = *puVar17 == 0xffffffff;
                    if (bVar23) break;
                  } while (*puVar17 != uVar19);
                }
                if (bVar23) {
                  local_44 = 0xffffffff;
                }
                bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          (&local_88,&local_44);
                uVar16 = uVar16 | 4;
              }
            }
            pLVar22 = pLVar22 + 1;
          } while (pLVar22 != pLVar1);
        }
        uVar20 = local_38;
        if (local_88.ebo_.size != 0) {
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                     &Potassco::idMax);
          local_a8.first_ = local_88.ebo_.buf;
          bk_lib::pod_vector<unsigned_int,std::allocator<unsigned_int>>::
          insert_impl<unsigned_int,bk_lib::detail::Memcpy<unsigned_int>>
                    ((pod_vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
                     (iterator)
                     (local_78.super_Node._0_8_ + ((ulong)local_78.super_Node.adj_ & 0xffffffff) * 4
                     ),local_88.ebo_.size,&local_a8);
        }
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                   &Potassco::idMax);
        initAtom(this,*(uint *)&(pPVar3->super_PrgHead).super_PrgNode.field_0x4 & 0xfffffff,uVar16,
                 (VarVec *)&local_78,(uint32)local_58);
        local_78.super_Node.adj_ = (NodeId *)((ulong)local_78.super_Node.adj_ & 0xffffffff00000000);
        local_88.ebo_._8_8_ = local_88.ebo_._8_8_ & 0xffffffff00000000;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar20);
  }
  pNVar11 = local_40;
  generator = local_a0;
  if ((((local_40->super_type).ebo_.size != 0) && (this->stats_ == (NonHcfStats *)0x0)) &&
     ((local_40->config != (Configuration *)0x0 &&
      (iVar13 = (*local_40->config->_vptr_Configuration[3])(),
      (*(byte *)(CONCAT44(extraout_var,iVar13) + 8) & 0x18) != 0)))) {
    iVar13 = (*pNVar11->config->_vptr_Configuration[3])();
    pNVar15 = enableNonHcfStats(this,*(uint *)(CONCAT44(extraout_var_00,iVar13) + 8) >> 3 & 3,
                                local_98->incData_ != (Incremental *)0x0);
    this->stats_ = pNVar15;
  }
  uVar20 = (ulong)(this->components_).ebo_.size;
  if (uVar20 != 0) {
    ppNVar9 = (this->components_).ebo_.buf;
    lVar18 = 0;
    do {
      NonHcfComponent::update(*(NonHcfComponent **)((long)ppNVar9 + lVar18),generator);
      lVar18 = lVar18 + 8;
    } while (uVar20 << 3 != lVar18);
  }
  uVar19 = *(uint *)&this->field_0x38 & 0x7fffffff;
  uVar20 = (ulong)uVar19;
  uVar16 = (pNVar11->super_type).ebo_.size;
  if (uVar19 != uVar16) {
    puVar10 = (pNVar11->super_type).ebo_.buf;
    lVar18 = (ulong)uVar16 * 4 + uVar20 * -4;
    do {
      addNonHcf(this,(uint32)uVar20,generator,pNVar11->config,puVar10[uVar20]);
      uVar20 = uVar20 + 1;
      lVar18 = lVar18 + -4;
    } while (lVar18 != 0);
  }
  *(uint *)&this->field_0x38 =
       *(uint *)&this->field_0x38 & 0x80000000 | (pNVar11->super_type).ebo_.size & 0x7fffffff;
  if (local_88.ebo_.buf != (uint *)0x0) {
    operator_delete(local_88.ebo_.buf);
  }
  if ((pointer)local_78.super_Node._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78.super_Node._0_8_);
  }
  return;
}

Assistant:

void PrgDepGraph::addSccs(LogicProgram& prg, const AtomList& sccAtoms, const NonHcfSet& nonHcfs) {
	// Pass 1: Create graph atom nodes and estimate number of bodies
	atoms_.reserve(atoms_.size() + sccAtoms.size());
	AtomList::size_type numBodies = 0;
	SharedContext& ctx = *prg.ctx();
	for (AtomList::size_type i = 0, end = sccAtoms.size(); i != end; ++i) {
		PrgAtom* a = sccAtoms[i];
		if (relevantPrgAtom(*ctx.master(), a)) {
			// add graph atom node and store link between program node and graph node for later lookup
			a->resetId(createAtom(a->literal(), a->scc()), true);
			// atom is defined by more than just a bunch of clauses
			ctx.setFrozen(a->var(), true);
			numBodies += a->supports();
		}
	}
	// Pass 2: Init atom nodes and create body nodes
	VarVec adj, ext;
	bodies_.reserve(bodies_.size() + numBodies/2);
	PrgBody* prgBody; PrgDisj* prgDis;
	for (AtomList::size_type i = 0, end = sccAtoms.size(); i != end; ++i) {
		PrgAtom*   a  = sccAtoms[i];
		if (relevantPrgAtom(*ctx.master(), a)) {
			uint32 prop = 0;
			for (PrgAtom::sup_iterator it = a->supps_begin(), endIt = a->supps_end(); it != endIt; ++it) {
				assert(it->isBody() || it->isDisj());
				NodeId bId= PrgNode::noNode;
				if (it->isBody() && !it->isGamma()) {
					prgBody = prg.getBody(it->node());
					bId     = relevantPrgBody(*ctx.master(), prgBody) ? addBody(prg, prgBody) : PrgNode::noNode;
				}
				else if (it->isDisj()) {
					prgDis  = prg.getDisj(it->node());
					bId     = addDisj(prg, prgDis);
					prop   |= AtomNode::property_in_disj;
				}
				if (bId != PrgNode::noNode) {
					if (!bodies_[bId].seen()) {
						bodies_[bId].seen(true);
						adj.push_back(bId);
					}
					if (it->isChoice()) {
						// mark atom as in choice
						prop |= AtomNode::property_in_choice;
					}
				}
			}
			uint32 nPred= (uint32)adj.size();
			for (PrgAtom::dep_iterator it = a->deps_begin(), endIt = a->deps_end(); it != endIt; ++it) {
				if (!it->sign()) {
					prgBody = prg.getBody(it->var());
					if (relevantPrgBody(*ctx.master(), prgBody) && prgBody->scc(prg) == a->scc()) {
						NodeId bodyId = addBody(prg, prgBody);
						if (!bodies_[bodyId].extended()) {
							adj.push_back(bodyId);
						}
						else {
							ext.push_back(bodyId);
							ext.push_back(bodies_[bodyId].get_pred_idx(a->id()));
							assert(bodies_[bodyId].get_pred(ext.back()) == a->id());
							prop |= AtomNode::property_in_ext;
						}
					}
				}
			}
			if (!ext.empty()) {
				adj.push_back(idMax);
				adj.insert(adj.end(), ext.begin(), ext.end());
			}
			adj.push_back(idMax);
			initAtom(a->id(), prop, adj, nPred);
			adj.clear(); ext.clear();
		}
	}
	if (nonHcfs.size() != 0 && stats_ == 0 && nonHcfs.config && nonHcfs.config->context().stats) {
		stats_ = enableNonHcfStats(nonHcfs.config->context().stats, prg.isIncremental());
	}
	// "update" existing non-hcf components
	for (NonHcfIter it = nonHcfBegin(), end = nonHcfEnd(); it != end; ++it) {
		(*it)->update(ctx);
	}
	// add new non-hcf components
	uint32 hcc = seenComponents_;
	for (NonHcfSet::const_iterator it = nonHcfs.begin() + seenComponents_, end = nonHcfs.end(); it != end; ++it, ++hcc) {
		addNonHcf(hcc, ctx, nonHcfs.config, *it);
	}
	seenComponents_ = nonHcfs.size();
}